

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraph.cc
# Opt level: O1

vector<long,_std::allocator<long>_> * __thiscall
SequenceDistanceGraph::oldnames_to_nodes
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,SequenceDistanceGraph *this,
          string *_oldnames)

{
  byte bVar1;
  iterator __position;
  byte *pbVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  long *plVar5;
  invalid_argument *piVar6;
  long *plVar7;
  long lVar8;
  byte *pbVar9;
  byte *__s;
  sgNodeID_t node;
  string oldname;
  long local_a0;
  SequenceDistanceGraph *local_98;
  key_type local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __s = (byte *)(_oldnames->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_98 = this;
  if (*__s != 0) {
    local_98 = (SequenceDistanceGraph *)&this->oldnames_to_ids;
    do {
      sVar3 = local_90._M_string_length;
      lVar8 = 0;
      pbVar2 = __s;
      while( true ) {
        pbVar9 = pbVar2 + 1;
        bVar1 = *pbVar2;
        if (((ulong)bVar1 < 0x2e) && ((0x280000000001U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) break;
        lVar8 = lVar8 + 1;
        pbVar2 = pbVar9;
      }
      if ((lVar8 == 0) || (bVar1 == 0)) {
        piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar6,"invalid path specification");
LAB_001747f2:
        __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      strlen((char *)__s);
      std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)sVar3,(ulong)__s);
      std::__cxx11::string::resize((ulong)&local_90,(char)lVar8);
      pmVar4 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)local_98,&local_90);
      local_a0 = *pmVar4;
      if (local_a0 == 0) {
        piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::operator+(&local_50,"node ",&local_90);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_70 = (long *)*plVar5;
        plVar7 = plVar5 + 2;
        if (local_70 == plVar7) {
          local_60 = *plVar7;
          lStack_58 = plVar5[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar7;
        }
        local_68 = plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::invalid_argument::invalid_argument(piVar6,(string *)&local_70);
        __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      if (*pbVar2 == 0x2d) {
        local_a0 = -local_a0;
      }
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                  ((vector<long,std::allocator<long>> *)__return_storage_ptr__,__position,&local_a0)
        ;
      }
      else {
        *__position._M_current = local_a0;
        (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      if (*pbVar9 == 0x2c) {
        __s = pbVar2 + 2;
      }
      else {
        __s = pbVar9;
        if (*pbVar9 != 0) {
          piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar6,"invalid path specification");
          goto LAB_001747f2;
        }
      }
    } while (*__s != 0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<sgNodeID_t> SequenceDistanceGraph::oldnames_to_nodes(std::string _oldnames) {
    std::vector<sgNodeID_t> nv;
    const char * s = _oldnames.c_str();
    const char * sign;
    std::string oldname;
    sgNodeID_t node;
    while (*s!= NULL){
        for (sign=s;*sign!=NULL and *sign !='+' and *sign!='-';++sign);
        if (sign ==s or *sign==NULL ) throw std::invalid_argument("invalid path specification");
        oldname=s;
        oldname.resize(sign-s);
        node=oldnames_to_ids[oldname];
        if (0==node) throw std::invalid_argument("node "+oldname+" doesn't exist in graph");
        if (*sign=='-') node=-node;
        nv.push_back(node);
        s=sign+1;
        if (*s==',') ++s;
        else if (*s!=NULL) throw std::invalid_argument("invalid path specification");

    }
    return nv;
}